

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O1

Cba_Man_t * Prs_ManBuildCbaVerilog(char *pFileName,Vec_Ptr_t *vDes)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  Prs_Ntk_t *pPVar5;
  uint uVar6;
  Abc_Nam_t *pAVar7;
  Abc_Nam_t *pAVar8;
  Abc_Nam_t *pAVar9;
  Cba_Man_t *pCVar10;
  char *pcVar11;
  size_t sVar12;
  Hash_IntMan_t *pHVar13;
  Vec_Int_t *pVVar14;
  int *piVar15;
  void **ppvVar16;
  Cba_Ntk_t *pCVar17;
  int iVar18;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  uint uVar23;
  uint uVar24;
  Vec_Ptr_t *pVVar25;
  int local_44;
  Vec_Ptr_t *local_40;
  long local_38;
  
  pvVar4 = *vDes->pArray;
  pAVar7 = Abc_NamRef(*(Abc_Nam_t **)((long)pvVar4 + 8));
  pAVar8 = Abc_NamRef(*(Abc_Nam_t **)((long)pvVar4 + 0x10));
  pAVar9 = Abc_NamStart(100,0x18);
  iVar20 = vDes->nSize;
  pHVar13 = *(Hash_IntMan_t **)((long)pvVar4 + 0x18);
  pHVar13->nRefs = pHVar13->nRefs + 1;
  local_40 = vDes;
  pCVar10 = (Cba_Man_t *)calloc(1,0x658);
  pcVar11 = Extra_FileDesignName(pFileName);
  pCVar10->pName = pcVar11;
  if (pFileName == (char *)0x0) {
    pcVar11 = (char *)0x0;
  }
  else {
    sVar12 = strlen(pFileName);
    pcVar11 = (char *)malloc(sVar12 + 1);
    strcpy(pcVar11,pFileName);
  }
  pCVar10->pSpec = pcVar11;
  if (pAVar7 == (Abc_Nam_t *)0x0) {
    pAVar7 = Abc_NamStart(1000,0x18);
  }
  pCVar10->pStrs = pAVar7;
  pAVar7 = pAVar8;
  if (pAVar8 == (Abc_Nam_t *)0x0) {
    pAVar7 = Abc_NamStart(100,0x18);
  }
  pCVar10->pFuns = pAVar7;
  if (pAVar9 == (Abc_Nam_t *)0x0) {
    pAVar9 = Abc_NamStart(100,0x18);
  }
  pCVar10->pMods = pAVar9;
  if (pHVar13 == (Hash_IntMan_t *)0x0) {
    pHVar13 = (Hash_IntMan_t *)calloc(1,0x18);
    uVar24 = 1099;
    while( true ) {
      do {
        uVar23 = uVar24;
        uVar24 = uVar23 + 1;
      } while ((uVar23 & 1) != 0);
      if (uVar24 < 9) break;
      iVar18 = 5;
      while( true ) {
        if (uVar24 % (iVar18 - 2U) == 0) break;
        uVar6 = iVar18 * iVar18;
        iVar18 = iVar18 + 2;
        if (uVar24 < uVar6) goto LAB_003e6cfb;
      }
    }
LAB_003e6cfb:
    pVVar14 = (Vec_Int_t *)malloc(0x10);
    uVar6 = 0x10;
    if (0xe < uVar23) {
      uVar6 = uVar24;
    }
    pVVar14->nSize = 0;
    pVVar14->nCap = uVar6;
    piVar15 = (int *)malloc((long)(int)uVar6 << 2);
    pVVar14->pArray = piVar15;
    pVVar14->nSize = uVar24;
    if (piVar15 != (int *)0x0) {
      memset(piVar15,0,(long)(int)uVar24 << 2);
    }
    pHVar13->vTable = pVVar14;
    pVVar14 = (Vec_Int_t *)malloc(0x10);
    pVVar14->nCap = 0x1130;
    pVVar14->nSize = 0;
    piVar15 = (int *)malloc(0x44c0);
    pVVar14->pArray = piVar15;
    pHVar13->vObjs = pVVar14;
    piVar15[0] = 0;
    piVar15[1] = 0;
    piVar15[2] = 0;
    piVar15[3] = 0;
    pVVar14->nSize = 4;
    pHVar13->nRefs = 1;
  }
  pCVar10->vHash = pHVar13;
  if (pAVar8 == (Abc_Nam_t *)0x0) {
    Abc_NamStrFindOrAdd(pAVar7,"1\'b0",(int *)0x0);
    Abc_NamStrFindOrAdd(pAVar7,"1\'b1",(int *)0x0);
    Abc_NamStrFindOrAdd(pAVar7,"1\'bx",(int *)0x0);
    Abc_NamStrFindOrAdd(pAVar7,"1\'bz",(int *)0x0);
  }
  pVVar25 = local_40;
  if ((pCVar10->vNtks).nCap <= iVar20) {
    lVar21 = (long)iVar20 + 1;
    ppvVar16 = (pCVar10->vNtks).pArray;
    sVar12 = lVar21 * 8;
    if (ppvVar16 == (void **)0x0) {
      ppvVar16 = (void **)malloc(sVar12);
    }
    else {
      ppvVar16 = (void **)realloc(ppvVar16,sVar12);
    }
    (pCVar10->vNtks).pArray = ppvVar16;
    (pCVar10->vNtks).nCap = (int)lVar21;
  }
  uVar24 = (pCVar10->vNtks).nSize;
  uVar23 = (pCVar10->vNtks).nCap;
  if (uVar24 == uVar23) {
    if ((int)uVar23 < 0x10) {
      ppvVar16 = (pCVar10->vNtks).pArray;
      if (ppvVar16 == (void **)0x0) {
        ppvVar16 = (void **)malloc(0x80);
      }
      else {
        ppvVar16 = (void **)realloc(ppvVar16,0x80);
      }
      (pCVar10->vNtks).pArray = ppvVar16;
      iVar20 = 0x10;
    }
    else {
      iVar20 = uVar23 * 2;
      if (iVar20 <= (int)uVar23) goto LAB_003e6ea2;
      ppvVar16 = (pCVar10->vNtks).pArray;
      if (ppvVar16 == (void **)0x0) {
        ppvVar16 = (void **)malloc((ulong)uVar23 << 4);
      }
      else {
        ppvVar16 = (void **)realloc(ppvVar16,(ulong)uVar23 << 4);
      }
      (pCVar10->vNtks).pArray = ppvVar16;
    }
    (pCVar10->vNtks).nCap = iVar20;
  }
LAB_003e6ea2:
  (pCVar10->vNtks).nSize = uVar24 + 1;
  (pCVar10->vNtks).pArray[(int)uVar24] = (void *)0x0;
  pCVar10->iRoot = 1;
  if (0 < pVVar25->nSize) {
    lVar21 = 0;
    do {
      pPVar5 = (Prs_Ntk_t *)pVVar25->pArray[lVar21];
      iVar20 = pPVar5->iModuleName;
      uVar24 = (pPVar5->vInputs).nSize;
      uVar23 = (pPVar5->vOutputs).nSize;
      lVar22 = (long)(int)(uVar23 + uVar24 + (pPVar5->vInouts).nSize) + (long)(pPVar5->vObjs).nSize;
      local_38 = lVar21;
      pCVar17 = (Cba_Ntk_t *)calloc(1,0x1b0);
      uVar6 = (uint)lVar22;
      if ((int)(uVar23 | uVar24 | uVar6) < 0) {
        __assert_fail("nIns >= 0 && nOuts >= 0 && nObjs >= 0 && nFins >= 0 && nFons >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                      ,0x1a5,"Cba_Ntk_t *Cba_NtkAlloc(Cba_Man_t *, int, int, int, int, int, int)");
      }
      uVar2 = (pCVar10->vNtks).nSize;
      pCVar17->Id = uVar2;
      uVar3 = (pCVar10->vNtks).nCap;
      if (uVar2 == uVar3) {
        if ((int)uVar3 < 0x10) {
          ppvVar16 = (pCVar10->vNtks).pArray;
          if (ppvVar16 == (void **)0x0) {
            ppvVar16 = (void **)malloc(0x80);
          }
          else {
            ppvVar16 = (void **)realloc(ppvVar16,0x80);
          }
          iVar18 = 0x10;
        }
        else {
          iVar18 = uVar3 * 2;
          if (iVar18 <= (int)uVar3) goto LAB_003e6fb5;
          ppvVar16 = (pCVar10->vNtks).pArray;
          if (ppvVar16 == (void **)0x0) {
            ppvVar16 = (void **)malloc((ulong)uVar3 << 4);
          }
          else {
            ppvVar16 = (void **)realloc(ppvVar16,(ulong)uVar3 << 4);
          }
        }
        (pCVar10->vNtks).pArray = ppvVar16;
        (pCVar10->vNtks).nCap = iVar18;
      }
LAB_003e6fb5:
      iVar18 = (pCVar10->vNtks).nSize;
      (pCVar10->vNtks).nSize = iVar18 + 1;
      (pCVar10->vNtks).pArray[iVar18] = pCVar17;
      pCVar17->NameId = iVar20;
      pCVar17->pDesign = pCVar10;
      if ((pCVar17->vInputs).nCap < (int)uVar24) {
        piVar15 = (pCVar17->vInputs).pArray;
        if (piVar15 == (int *)0x0) {
          piVar15 = (int *)malloc((long)(int)uVar24 << 2);
        }
        else {
          piVar15 = (int *)realloc(piVar15,(long)(int)uVar24 << 2);
        }
        (pCVar17->vInputs).pArray = piVar15;
        if (piVar15 == (int *)0x0) goto LAB_003e7476;
        (pCVar17->vInputs).nCap = uVar24;
      }
      if ((pCVar17->vOutputs).nCap < (int)uVar23) {
        piVar15 = (pCVar17->vOutputs).pArray;
        if (piVar15 == (int *)0x0) {
          piVar15 = (int *)malloc((long)(int)uVar23 << 2);
        }
        else {
          piVar15 = (int *)realloc(piVar15,(long)(int)uVar23 << 2);
        }
        (pCVar17->vOutputs).pArray = piVar15;
        if (piVar15 == (int *)0x0) goto LAB_003e7476;
        (pCVar17->vOutputs).nCap = uVar23;
      }
      if ((pCVar17->vObjType).nCap <= (int)uVar6) {
        sVar12 = lVar22 + 1;
        pcVar11 = (pCVar17->vObjType).pArray;
        if (pcVar11 == (char *)0x0) {
          pcVar11 = (char *)malloc(sVar12);
        }
        else {
          pcVar11 = (char *)realloc(pcVar11,sVar12);
        }
        (pCVar17->vObjType).pArray = pcVar11;
        (pCVar17->vObjType).nCap = (int)sVar12;
      }
      uVar24 = (pCVar17->vObjType).nCap;
      if ((pCVar17->vObjType).nSize == uVar24) {
        if ((int)uVar24 < 0x10) {
          pcVar11 = (pCVar17->vObjType).pArray;
          if (pcVar11 == (char *)0x0) {
            pcVar11 = (char *)malloc(0x10);
          }
          else {
            pcVar11 = (char *)realloc(pcVar11,0x10);
          }
          (pCVar17->vObjType).pArray = pcVar11;
          sVar12 = 0x10;
        }
        else {
          sVar12 = (ulong)uVar24 * 2;
          if ((int)sVar12 <= (int)uVar24) goto LAB_003e70f1;
          pcVar11 = (pCVar17->vObjType).pArray;
          if (pcVar11 == (char *)0x0) {
            pcVar11 = (char *)malloc(sVar12);
          }
          else {
            pcVar11 = (char *)realloc(pcVar11,sVar12);
          }
          (pCVar17->vObjType).pArray = pcVar11;
        }
        (pCVar17->vObjType).nCap = (int)sVar12;
      }
LAB_003e70f1:
      iVar20 = (pCVar17->vObjType).nSize;
      (pCVar17->vObjType).nSize = iVar20 + 1;
      (pCVar17->vObjType).pArray[iVar20] = '\0';
      pVVar14 = &pCVar17->vObjFin0;
      iVar20 = uVar6 + 2;
      if ((pCVar17->vObjFin0).nCap < iVar20) {
        piVar15 = (pCVar17->vObjFin0).pArray;
        if (piVar15 == (int *)0x0) {
          piVar15 = (int *)malloc((long)iVar20 << 2);
        }
        else {
          piVar15 = (int *)realloc(piVar15,(long)iVar20 << 2);
        }
        (pCVar17->vObjFin0).pArray = piVar15;
        if (piVar15 == (int *)0x0) goto LAB_003e7476;
        pVVar14->nCap = iVar20;
      }
      Vec_IntPush(pVVar14,0);
      Vec_IntPush(pVVar14,1);
      pVVar14 = &pCVar17->vObjFon0;
      if ((pCVar17->vObjFon0).nCap < iVar20) {
        piVar15 = (pCVar17->vObjFon0).pArray;
        if (piVar15 == (int *)0x0) {
          piVar15 = (int *)malloc((long)iVar20 << 2);
        }
        else {
          piVar15 = (int *)realloc(piVar15,(long)iVar20 << 2);
        }
        (pCVar17->vObjFon0).pArray = piVar15;
        if (piVar15 == (int *)0x0) goto LAB_003e7476;
        pVVar14->nCap = iVar20;
      }
      Vec_IntPush(pVVar14,0);
      Vec_IntPush(pVVar14,1);
      if ((pCVar17->vFinFon).nCap < 0x65) {
        piVar15 = (pCVar17->vFinFon).pArray;
        if (piVar15 == (int *)0x0) {
          piVar15 = (int *)malloc(0x194);
        }
        else {
          piVar15 = (int *)realloc(piVar15,0x194);
        }
        (pCVar17->vFinFon).pArray = piVar15;
        if (piVar15 == (int *)0x0) goto LAB_003e7476;
        (pCVar17->vFinFon).nCap = 0x65;
      }
      Vec_IntPush(&pCVar17->vFinFon,0);
      if ((pCVar17->vFonObj).nCap < 0x65) {
        piVar15 = (pCVar17->vFonObj).pArray;
        if (piVar15 == (int *)0x0) {
          piVar15 = (int *)malloc(0x194);
        }
        else {
          piVar15 = (int *)realloc(piVar15,0x194);
        }
        (pCVar17->vFonObj).pArray = piVar15;
        if (piVar15 == (int *)0x0) {
LAB_003e7476:
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        (pCVar17->vFonObj).nCap = 0x65;
      }
      Vec_IntPush(&pCVar17->vFonObj,0);
      Prs_CreateVerilogPio(pCVar17,pPVar5);
      pAVar7 = pCVar10->pMods;
      pcVar11 = Abc_NamStr(pCVar17->pDesign->pStrs,pCVar17->NameId);
      iVar20 = Abc_NamStrFindOrAdd(pAVar7,pcVar11,&local_44);
      if (local_44 == 0) {
        if (iVar20 != pCVar17->Id) {
          __assert_fail("NtkId == pNtk->Id",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                        ,0x1f7,"void Cba_NtkAdd(Cba_Man_t *, Cba_Ntk_t *)");
        }
      }
      else {
        pcVar11 = Abc_NamStr(pCVar17->pDesign->pStrs,pCVar17->NameId);
        printf("Network with name \"%s\" already exists.\n",pcVar11);
      }
      lVar21 = local_38 + 1;
      pVVar25 = local_40;
    } while (lVar21 < local_40->nSize);
  }
  if (0 < pVVar25->nSize) {
    lVar21 = 0;
    do {
      pPVar5 = (Prs_Ntk_t *)pVVar25->pArray[lVar21];
      pcVar11 = Abc_NamStr(pPVar5->pStrs,pPVar5->iModuleName);
      printf("Building module \"%s\"...\n",pcVar11);
      lVar22 = lVar21 + 1;
      if (lVar22 < (pCVar10->vNtks).nSize) {
        pCVar17 = (Cba_Ntk_t *)(pCVar10->vNtks).pArray[lVar21 + 1];
      }
      else {
        pCVar17 = (Cba_Ntk_t *)0x0;
      }
      Prs_CreateVerilogNtk(pCVar17,pPVar5);
      lVar21 = lVar22;
    } while (lVar22 < pVVar25->nSize);
  }
  if (1 < (pCVar10->vNtks).nSize) {
    lVar21 = 1;
    do {
      pCVar17 = (Cba_Ntk_t *)(pCVar10->vNtks).pArray[lVar21];
      if ((pCVar17->vSeq).nSize != 0) {
        __assert_fail("Cba_NtkBoxSeqNum(p) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                      ,0x228,"void Cba_NtkPrepareSeq(Cba_Ntk_t *)");
      }
      iVar20 = Cba_NtkIsSeq(pCVar17);
      if ((iVar20 != 0) && (1 < (pCVar17->vObjType).nSize)) {
        lVar22 = 1;
        uVar19 = extraout_RDX;
        do {
          if ((pCVar17->vObjType).nSize <= lVar22) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                          ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
          }
          bVar1 = (pCVar17->vObjType).pArray[lVar22];
          if (0xffffffa8 < bVar1 - 0x5a) {
            if (bVar1 == 3) {
              if ((pCVar17->vObjFunc).nSize < 1) {
                uVar24 = 0;
              }
              else {
                Vec_IntFillExtra(&pCVar17->vObjFunc,(int)lVar22 + 1,(int)uVar19);
                if ((pCVar17->vObjFunc).nSize <= lVar22) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
                }
                uVar24 = (pCVar17->vObjFunc).pArray[lVar22];
                uVar19 = extraout_RDX_00;
              }
              uVar24 = *(uint *)((long)(pCVar17->pDesign->vNtks).pArray[uVar24] + 0x14) >> 2 & 1;
            }
            else {
              uVar24 = (uint)(bVar1 - 0x4c < 0xc);
            }
            if (uVar24 != 0) {
              Vec_IntPush(&pCVar17->vSeq,(int)lVar22);
              uVar19 = extraout_RDX_01;
            }
          }
          lVar22 = lVar22 + 1;
        } while (lVar22 < (pCVar17->vObjType).nSize);
      }
      lVar21 = lVar21 + 1;
    } while (lVar21 < (pCVar10->vNtks).nSize);
  }
  return pCVar10;
}

Assistant:

Cba_Man_t * Prs_ManBuildCbaVerilog( char * pFileName, Vec_Ptr_t * vDes )
{
    Prs_Ntk_t * pPrsNtk; int i, fError = 0;
    Prs_Ntk_t * pPrsRoot = Prs_ManRoot(vDes);
    // start the manager
    Abc_Nam_t * pStrs = Abc_NamRef(pPrsRoot->pStrs);
    Abc_Nam_t * pFuns = Abc_NamRef(pPrsRoot->pFuns);
    Abc_Nam_t * pMods = Abc_NamStart( 100, 24 );
    Cba_Man_t * p = Cba_ManAlloc( pFileName, Vec_PtrSize(vDes), pStrs, pFuns, pMods, Hash_IntManRef(pPrsRoot->vHash) );
    // initialize networks
    Vec_PtrForEachEntry( Prs_Ntk_t *, vDes, pPrsNtk, i )
    {
        Cba_Ntk_t * pNtk = Cba_NtkAlloc( p, Prs_NtkId(pPrsNtk), Prs_NtkPiNum(pPrsNtk), Prs_NtkPoNum(pPrsNtk), Prs_NtkObjNum(pPrsNtk), 100, 100 );
        Prs_CreateVerilogPio( pNtk, pPrsNtk );
        Cba_NtkAdd( p, pNtk );
    }
    // create networks
    Vec_PtrForEachEntry( Prs_Ntk_t *, vDes, pPrsNtk, i )
    {
        printf( "Building module \"%s\"...\n", Prs_NtkName(pPrsNtk) );
        fError = Prs_CreateVerilogNtk( Cba_ManNtk(p, i+1), pPrsNtk );
        if ( fError )
            break;
    }
    if ( fError )
        printf( "Quitting because of errors.\n" );
    else
        Cba_ManPrepareSeq( p );
    return p;
}